

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort.scat.c
# Opt level: O0

void ga_sort_gath(Integer *pn,Integer *i,Integer *j,Integer *base)

{
  Integer IVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  Integer *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  ulong *in_RDI;
  long ib_2;
  long ia_2;
  Integer ltmp_2;
  long ib_1;
  long ia_1;
  Integer ltmp_1;
  long ib;
  long ia;
  Integer ltmp;
  Integer *base0;
  Integer n;
  Integer *hi;
  Integer *q;
  Integer *p;
  unsigned_long g;
  unsigned_long gap;
  
  if (1 < (long)*in_RDI) {
    hi = (Integer *)((long)*in_RDI >> 1);
    ia = (long)(in_RCX + (long)hi * 2 + -1);
    if ((*in_RDI & 1) != 0) {
      ia = ia + 8;
    }
    for (; hi != (Integer *)0x1; hi = (Integer *)((long)hi + -1)) {
      n = (Integer)hi;
      base0 = in_RCX + (long)hi + -1;
      while (ltmp = (Integer)(base0 + n), (ulong)ltmp <= (ulong)ia) {
        n = n * 2;
        if ((ltmp != ia) && (*(long *)ltmp < *(long *)(ltmp + 8))) {
          ltmp = ltmp + 8;
          n = n + 1;
        }
        if (*(long *)ltmp <= *base0) break;
        lVar3 = (long)base0 - (long)in_RCX >> 3;
        lVar4 = ltmp - (long)in_RCX >> 3;
        IVar1 = *base0;
        *base0 = *(Integer *)ltmp;
        *(Integer *)ltmp = IVar1;
        uVar2 = in_RSI[lVar3];
        in_RSI[lVar3] = in_RSI[lVar4];
        in_RSI[lVar4] = uVar2;
        uVar2 = in_RDX[lVar3];
        in_RDX[lVar3] = in_RDX[lVar4];
        in_RDX[lVar4] = uVar2;
        base0 = (Integer *)ltmp;
      }
    }
    for (; (Integer *)ia != in_RCX; ia = ia + -8) {
      n = 1;
      base0 = in_RCX;
      while (ltmp = (Integer)(base0 + n), (ulong)ltmp <= (ulong)ia) {
        n = n * 2;
        if ((ltmp != ia) && (*(long *)ltmp < *(long *)(ltmp + 8))) {
          ltmp = ltmp + 8;
          n = n + 1;
        }
        if (*(long *)ltmp <= *base0) break;
        lVar3 = (long)base0 - (long)in_RCX >> 3;
        lVar4 = ltmp - (long)in_RCX >> 3;
        IVar1 = *base0;
        *base0 = *(Integer *)ltmp;
        *(Integer *)ltmp = IVar1;
        uVar2 = in_RSI[lVar3];
        in_RSI[lVar3] = in_RSI[lVar4];
        in_RSI[lVar4] = uVar2;
        uVar2 = in_RDX[lVar3];
        in_RDX[lVar3] = in_RDX[lVar4];
        in_RDX[lVar4] = uVar2;
        base0 = (Integer *)ltmp;
      }
      lVar3 = ia - (long)in_RCX >> 3;
      IVar1 = *in_RCX;
      *in_RCX = *(Integer *)ia;
      *(Integer *)ia = IVar1;
      uVar2 = *in_RSI;
      *in_RSI = in_RSI[lVar3];
      in_RSI[lVar3] = uVar2;
      uVar2 = *in_RDX;
      *in_RDX = in_RDX[lVar3];
      in_RDX[lVar3] = uVar2;
    }
  }
  return;
}

Assistant:

void ga_sort_gath(pn, i, j, base)
     Integer *pn;
     Integer *i;
     Integer *j;
     Integer *base;
{

  if (*pn < 2) return;
  
#  undef SWAP  
#  define SWAP(a,b) { \
    Integer ltmp; \
    long ia = a - base; \
    long ib = b - base; \
    ltmp=*a; *a=*b; *b=ltmp; \
    ltmp=i[ia]; i[ia]=i[ib]; i[ib]=ltmp; \
    ltmp=j[ia]; j[ia]=j[ib]; j[ib]=ltmp; \
  }
  INDEX_SORT(base,pn,SWAP);
}